

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSop(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_3c;
  int local_38;
  int nCubeLimit;
  int fMode;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  local_38 = -1;
  local_3c = 1000000;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Cdnh");
      if (iVar1 == -1) {
        if (pNtk_00 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          return 1;
        }
        iVar1 = Abc_NtkIsLogic(pNtk_00);
        if (iVar1 == 0) {
          Abc_Print(-1,"Converting to SOP is possible only for logic networks.\n");
          return 1;
        }
        iVar1 = Abc_NtkToSop(pNtk_00,local_38,local_3c);
        if (iVar1 == 0) {
          Abc_Print(-1,"Converting to SOP has failed.\n");
          return 0;
        }
        return 0;
      }
      if (iVar1 == 0x43) break;
      if (iVar1 == 100) {
        local_38 = 1;
      }
      else {
        if ((iVar1 == 0x68) || (iVar1 != 0x6e)) goto LAB_00221f68;
        local_38 = 0;
      }
    }
    if (argc <= globalUtilOptind) break;
    local_3c = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)local_3c < 0) {
LAB_00221f68:
      Abc_Print(-2,"usage: sop [-C num] [-dnh]\n");
      Abc_Print(-2,"\t         converts node functions to SOP\n");
      Abc_Print(-2,"\t-C num : the limit on the number of cubes at a node [default = %d]\n",
                (ulong)local_3c);
      pcVar2 = "no";
      if (local_38 == 1) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggles using only positive polarity [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_38 == 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-n     : toggles using only negative polarity [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
  goto LAB_00221f68;
}

Assistant:

int Abc_CommandSop( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c, fMode = -1, nCubeLimit = 1000000;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Cdnh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubeLimit < 0 )
                goto usage;
            break;
        case 'd':
            fMode = 1;
            break;
        case 'n':
            fMode = 0;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "Converting to SOP is possible only for logic networks.\n" );
        return 1;
    }
    if ( !Abc_NtkToSop(pNtk, fMode, nCubeLimit) )
    {
        Abc_Print( -1, "Converting to SOP has failed.\n" );
        return 0;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: sop [-C num] [-dnh]\n" );
    Abc_Print( -2, "\t         converts node functions to SOP\n" );
    Abc_Print( -2, "\t-C num : the limit on the number of cubes at a node [default = %d]\n", nCubeLimit );
    Abc_Print( -2, "\t-d     : toggles using only positive polarity [default = %s]\n", fMode == 1 ? "yes": "no"  );
    Abc_Print( -2, "\t-n     : toggles using only negative polarity [default = %s]\n", fMode == 0 ? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}